

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::TreeEnsembleParameters::MergePartialFromCodedStream
          (TreeEnsembleParameters *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  Type *this_00;
  pair<int,_int> pVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  int byte_limit;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00151819;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00151819:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar11 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar5 | uVar11;
    }
    uVar5 = (uint32)uVar11;
    iVar8 = 6;
    iVar9 = iVar8;
    if ((uVar11 & 0x100000000) == 0) goto LAB_0015183a;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar6 == 3) {
      if (cVar10 == '\x19') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,0x1a,input,&this->basepredictionvalue_);
      }
      else {
        if ((uVar5 & 0xff) != 0x1a) goto LAB_0015183a;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&this->basepredictionvalue_);
      }
LAB_00151859:
      iVar9 = iVar8;
      if (bVar4 != false) {
LAB_0015185f:
        iVar9 = 0;
      }
    }
    else {
      if (uVar6 == 2) {
        if (cVar10 != '\x10') goto LAB_0015183a;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (-1 < (long)(char)*puVar3)) {
          this->numpredictiondimensions_ = (long)(char)*puVar3;
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->numpredictiondimensions_ = pVar12.first;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_00151861;
        }
        goto LAB_0015185f;
      }
      if ((uVar6 == 1) && (cVar10 == '\n')) {
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                            (&(this->nodes_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < (char)*puVar3))
        {
          input->buffer_ = puVar3 + 1;
          bVar4 = true;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar4 = -1 < byte_limit;
        }
        if (((bVar4) &&
            (pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,byte_limit), -1 < (long)pVar7)) &&
           (bVar4 = TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream(this_00,input),
           bVar4)) {
          bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar7.first);
          goto LAB_00151859;
        }
      }
      else {
LAB_0015183a:
        iVar9 = 7;
        if ((uVar5 & 7) != 4 && uVar5 != 0) {
          bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
          goto LAB_00151859;
        }
      }
    }
LAB_00151861:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleParameters::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleParameters)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nodes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 numPredictionDimensions = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &numpredictiondimensions_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double basePredictionValue = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_basepredictionvalue())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(25u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 26u, input, this->mutable_basepredictionvalue())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleParameters)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleParameters)
  return false;
#undef DO_
}